

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int disposition_get_role(DISPOSITION_HANDLE disposition,role *role_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint32_t local_1c;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar3 = 0x217b;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(disposition->composite_value,&local_1c);
    iVar3 = 0x2183;
    if (iVar1 == 0) {
      if (local_1c == 0) {
        iVar3 = 0x2189;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(disposition->composite_value,0);
        iVar3 = 0x2191;
        if ((value != (AMQP_VALUE)0x0) &&
           (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
          iVar1 = amqpvalue_get_boolean(value,role_value);
          iVar3 = 0x2198;
          if (iVar1 == 0) {
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int disposition_get_role(DISPOSITION_HANDLE disposition, role* role_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        if (amqpvalue_get_composite_item_count(disposition_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(disposition_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_role(item_value, role_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}